

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2polygon.cc
# Opt level: O3

void __thiscall S2Polygon::InitFromBuilder(S2Polygon *this,S2Polygon *a,S2Builder *builder)

{
  bool bVar1;
  double dVar2;
  S2Error error;
  _Head_base<0UL,_S2Builder::Layer_*,_false> local_60;
  undefined1 local_58 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  S2LogMessage local_30;
  
  local_30._0_8_ = this;
  absl::make_unique<s2builderutil::S2PolygonLayer,S2Polygon*>
            ((absl *)local_58,(S2Polygon **)&local_30);
  local_60._M_head_impl = (Layer *)local_58._0_8_;
  local_58._0_8_ = (Layer *)0x0;
  S2Builder::StartLayer
            (builder,(unique_ptr<S2Builder::Layer,_std::default_delete<S2Builder::Layer>_> *)
                     &local_60);
  if (local_60._M_head_impl != (Layer *)0x0) {
    (*(local_60._M_head_impl)->_vptr_Layer[1])();
  }
  local_60._M_head_impl = (Layer *)0x0;
  if ((Layer *)local_58._0_8_ != (Layer *)0x0) {
    (*(*(_func_int ***)local_58._0_8_)[1])();
  }
  S2Builder::AddPolygon(builder,a);
  local_58._0_8_ = local_58._0_8_ & 0xffffffff00000000;
  local_58._16_8_ = 0;
  local_40._M_local_buf[0] = '\0';
  local_58._8_8_ = &local_40;
  bVar1 = S2Builder::Build(builder,(S2Error *)local_58);
  if (bVar1) {
    if ((int)((ulong)((long)(this->loops_).
                            super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->loops_).
                           super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 3) == 0) {
      dVar2 = S2LatLngRect::Area(&a->bound_);
      if (6.283185307179586 < dVar2) {
        dVar2 = GetArea(a);
        if (6.283185307179586 < dVar2) {
          Invert(this);
        }
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._8_8_ != &local_40) {
      operator_delete((void *)local_58._8_8_);
    }
    return;
  }
  S2LogMessage::S2LogMessage
            (&local_30,
             "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2polygon.cc"
             ,0x3da,kFatal,(ostream *)&std::cerr);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_30.stream_,"Could not build polygon: ",0x19);
  ::operator<<(local_30.stream_,(S2Error *)local_58);
  abort();
}

Assistant:

void S2Polygon::InitFromBuilder(const S2Polygon& a, S2Builder* builder) {
  builder->StartLayer(make_unique<S2PolygonLayer>(this));
  builder->AddPolygon(a);
  S2Error error;
  if (!builder->Build(&error)) {
    S2_LOG(DFATAL) << "Could not build polygon: " << error;
  }
  // If there are no loops, check whether the result should be the full
  // polygon rather than the empty one.  (See InitToApproxIntersection.)
  if (num_loops() == 0) {
    if (a.bound_.Area() > 2 * M_PI && a.GetArea() > 2 * M_PI) Invert();
  }
}